

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool tinyusdz::is_identity(matrix2d *m)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  dVar1 = m->m[0][0];
  if (-1 < (long)dVar1) {
    uVar3 = (long)dVar1 + 0xc010000000000000;
    uVar4 = -uVar3;
    if (0 < (long)uVar3) {
      uVar4 = uVar3;
    }
    if (uVar4 < 2) {
      dVar1 = m->m[0][1];
      bVar2 = ABS(dVar1) == 0.0;
      if (-1 < (long)dVar1) {
        bVar2 = (ulong)dVar1 < 2;
      }
      if (bVar2) {
        dVar1 = m->m[1][0];
        bVar2 = (ulong)dVar1 < 2;
        if ((long)dVar1 < 0) {
          bVar2 = ABS(dVar1) == 0.0;
        }
        if (bVar2) {
          dVar1 = m->m[1][1];
          if (-1 < (long)dVar1) {
            return (ulong)dVar1 < 2;
          }
          return ABS(dVar1) == 0.0;
        }
      }
    }
  }
  return false;
}

Assistant:

bool is_identity(const value::matrix2d &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][1], 0.0, uint64_t(kIdentityMaxUlps));
}